

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void generate_exception_err(DisasContext_conflict6 *ctx,int excp,int err)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGArg a2;
  TCGContext_conflict6 *tcg_ctx_00;
  uint uVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  pTVar2 = tcg_const_i32_mips64el(tcg_ctx,excp);
  pTVar3 = tcg_const_i32_mips64el(tcg_ctx,err);
  a2 = (ctx->base).pc_next;
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (a2 != ctx->saved_pc) {
    tcg_gen_op2_mips64el
              (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->cpu_pc + (long)tcg_ctx_00),a2);
    ctx->saved_pc = (ctx->base).pc_next;
  }
  if (ctx->hflags != ctx->saved_hflags) {
    tcg_gen_op2_mips64el
              (tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(tcg_ctx_00->hflags + (long)tcg_ctx_00),
               (long)(int)ctx->hflags);
    ctx->saved_hflags = ctx->hflags;
    uVar1 = ctx->hflags & 0x803800;
    if (((uVar1 == 0x800) || (uVar1 == 0x1800)) || (uVar1 == 0x1000)) {
      tcg_gen_op2_mips64el
                (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->btarget + (long)tcg_ctx_00),
                 ctx->btarget);
    }
  }
  local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
  tcg_gen_callN_mips64el(tcg_ctx,helper_raise_exception_err_mips64el,(TCGTemp *)0x0,3,&local_48);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static inline void generate_exception_err(DisasContext *ctx, int excp, int err)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 texcp = tcg_const_i32(tcg_ctx, excp);
    TCGv_i32 terr = tcg_const_i32(tcg_ctx, err);
    save_cpu_state(ctx, 1);
    gen_helper_raise_exception_err(tcg_ctx, tcg_ctx->cpu_env, texcp, terr);
    tcg_temp_free_i32(tcg_ctx, terr);
    tcg_temp_free_i32(tcg_ctx, texcp);
    ctx->base.is_jmp = DISAS_NORETURN;
}